

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void gnns::save_to_file<unsigned_int>(Matrix<unsigned_int> *m,string *file_name)

{
  char *__filename;
  GnnsException *this;
  uint *__ptr;
  uint local_9c;
  int i;
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  FILE *local_20;
  FILE *fp;
  string *file_name_local;
  Matrix<unsigned_int> *m_local;
  
  fp = (FILE *)file_name;
  file_name_local = (string *)m;
  __filename = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(__filename,"wb");
  if (local_20 == (FILE *)0x0) {
    this = (GnnsException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"File ",&local_81);
    std::operator+(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80);
    std::operator+(local_40,(char *)local_60);
    GnnsException::GnnsException(this,local_40);
    __cxa_throw(this,&GnnsException::typeinfo,GnnsException::~GnnsException);
  }
  for (local_9c = 0; local_9c < *(uint *)(file_name_local + 4); local_9c = local_9c + 1) {
    fwrite(file_name_local,4,1,local_20);
    __ptr = Matrix<unsigned_int>::operator[]((Matrix<unsigned_int> *)file_name_local,local_9c);
    fwrite(__ptr,(ulong)*(uint *)file_name_local << 2,1,local_20);
  }
  fclose(local_20);
  return;
}

Assistant:

void save_to_file(const Matrix<T>& m, const std::string& file_name)
    {
        FILE *fp = fopen(file_name.c_str(), "wb");

        if(fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        for(int i=0;i<m.rows;++i)
        {
            //write the dim
            fwrite(&m.cols, 4, 1, fp);
            //write the row data
            fwrite(m[i], sizeof(T)*m.cols, 1, fp);
        }

        fclose(fp);
    }